

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setGraphicsEffect(QGraphicsItem *this,QGraphicsEffect *effect)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItem *i;
  QObject *parent;
  QGraphicsEffect *in_RSI;
  long in_RDI;
  QGraphicsItem *in_stack_00000008;
  QGraphicsEffectSource *source;
  QGraphicsEffectSourcePrivate *sourced;
  QGraphicsItemPrivate *in_stack_ffffffffffffffc0;
  QGraphicsEffectSourcePrivate *in_stack_ffffffffffffffc8;
  QGraphicsEffectPrivate *in_stack_ffffffffffffffd0;
  
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 8));
  if (pQVar1->graphicsEffect != in_RSI) {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    if (pQVar1->graphicsEffect == (QGraphicsEffect *)0x0) {
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 8));
      if (pQVar1->parent != (QGraphicsItem *)0x0) {
        pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)(in_RDI + 8));
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&pQVar1->parent->d_ptr);
        QGraphicsItemPrivate::updateChildWithGraphicsEffectFlagRecursively
                  (in_stack_ffffffffffffffc0);
      }
    }
    else {
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 8));
      in_stack_ffffffffffffffd0 = (QGraphicsEffectPrivate *)pQVar1->graphicsEffect;
      if (in_stack_ffffffffffffffd0 != (QGraphicsEffectPrivate *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffffd0 + 0x20))();
      }
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 8));
      pQVar1->graphicsEffect = (QGraphicsEffect *)0x0;
    }
    if (in_RSI != (QGraphicsEffect *)0x0) {
      i = (QGraphicsItem *)operator_new(0xf0);
      QGraphicsItemEffectSourcePrivate::QGraphicsItemEffectSourcePrivate
                ((QGraphicsItemEffectSourcePrivate *)in_stack_ffffffffffffffc0,i);
      parent = (QObject *)operator_new(0x10);
      QGraphicsEffectSource::QGraphicsEffectSource
                ((QGraphicsEffectSource *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,parent
                );
      pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 8));
      pQVar1->graphicsEffect = in_RSI;
      QGraphicsEffect::d_func((QGraphicsEffect *)0x97c40e);
      QGraphicsEffectPrivate::setGraphicsEffectSource
                (in_stack_ffffffffffffffd0,(QGraphicsEffectSource *)in_RSI);
      prepareGeometryChange(in_stack_00000008);
    }
  }
  return;
}

Assistant:

void QGraphicsItem::setGraphicsEffect(QGraphicsEffect *effect)
{
    if (d_ptr->graphicsEffect == effect)
        return;

    if (d_ptr->graphicsEffect) {
        delete d_ptr->graphicsEffect;
        d_ptr->graphicsEffect = nullptr;
    } else if (d_ptr->parent) {
        d_ptr->parent->d_ptr->updateChildWithGraphicsEffectFlagRecursively();
    }

    if (effect) {
        // Set new effect.
        QGraphicsEffectSourcePrivate *sourced = new QGraphicsItemEffectSourcePrivate(this);
        QGraphicsEffectSource *source = new QGraphicsEffectSource(*sourced);
        d_ptr->graphicsEffect = effect;
        effect->d_func()->setGraphicsEffectSource(source);
        prepareGeometryChange();
    }
}